

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testCreateNewOrderSingle(int count)

{
  long lVar1;
  long lVar2;
  NewOrderSingle local_420;
  undefined1 local_2c8 [8];
  OrdType ordType;
  TransactTime transactTime;
  Side side;
  STRING local_1a0;
  undefined1 local_180 [8];
  Symbol symbol;
  undefined1 local_118 [8];
  HandlInst handlInst;
  allocator<char> local_a1;
  STRING local_a0;
  undefined1 local_80 [8];
  ClOrdID clOrdID;
  int i;
  long start;
  int count_local;
  
  lVar1 = GetTickCount();
  for (clOrdID.super_StringField.super_FieldBase.m_metrics._12_4_ = 0;
      (int)clOrdID.super_StringField.super_FieldBase.m_metrics._12_4_ <= count;
      clOrdID.super_StringField.super_FieldBase.m_metrics._12_4_ =
           clOrdID.super_StringField.super_FieldBase.m_metrics._12_4_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"ORDERID",&local_a1);
    FIX::ClOrdID::ClOrdID((ClOrdID *)local_80,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    symbol.super_StringField.super_FieldBase.m_metrics._15_1_ = 0x31;
    FIX::HandlInst::HandlInst
              ((HandlInst *)local_118,&symbol.super_StringField.super_FieldBase.m_metrics.field_0xf)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"LNUX",
               (allocator<char> *)&side.super_CharField.super_FieldBase.m_metrics.field_0xf);
    FIX::Symbol::Symbol((Symbol *)local_180,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)&side.super_CharField.super_FieldBase.m_metrics.field_0xf);
    FIX::Side::Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics.
                             m_checksum,"11");
    FIX::TransactTime::TransactTime
              ((TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics.m_checksum);
    FIX::OrdType::OrdType((OrdType *)local_2c8,"1");
    FIX42::NewOrderSingle::NewOrderSingle
              (&local_420,(ClOrdID *)local_80,(HandlInst *)local_118,(Symbol *)local_180,
               (Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum,
               (TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics.m_checksum,
               (OrdType *)local_2c8);
    FIX42::NewOrderSingle::~NewOrderSingle(&local_420);
    FIX::OrdType::~OrdType((OrdType *)local_2c8);
    FIX::TransactTime::~TransactTime
              ((TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics.m_checksum);
    FIX::Side::~Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics.
                              m_checksum);
    FIX::Symbol::~Symbol((Symbol *)local_180);
    FIX::HandlInst::~HandlInst((HandlInst *)local_118);
    FIX::ClOrdID::~ClOrdID((ClOrdID *)local_80);
  }
  lVar2 = GetTickCount();
  return lVar2 - lVar1;
}

Assistant:

long testCreateNewOrderSingle( int count )
{
  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    FIX::ClOrdID clOrdID( "ORDERID" );
    FIX::HandlInst handlInst( '1' );
    FIX::Symbol symbol( "LNUX" );
    FIX::Side side( FIX::Side_BUY );
    FIX::TransactTime transactTime;
    FIX::OrdType ordType( FIX::OrdType_MARKET );
    FIX42::NewOrderSingle( clOrdID, handlInst, symbol, side, transactTime, ordType );
  }

  return GetTickCount() - start;
}